

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_visit.c
# Opt level: O0

int emit_object(json_object *jso,int flags,json_object *parent_jso,char *jso_key,size_t *jso_index,
               void *userarg)

{
  undefined8 uVar1;
  size_t local_58;
  char *local_48;
  void *userarg_local;
  size_t *jso_index_local;
  char *jso_key_local;
  json_object *parent_jso_local;
  int flags_local;
  json_object *jso_local;
  
  local_48 = jso_key;
  if (jso_key == (char *)0x0) {
    local_48 = "(null)";
  }
  if (jso_index == (size_t *)0x0) {
    local_58 = 0xffffffffffffffff;
  }
  else {
    local_58 = *jso_index;
  }
  uVar1 = json_object_to_json_string(jso);
  printf("flags: 0x%x, key: %s, index: %ld, value: %s\n",(ulong)(uint)flags,local_48,local_58,uVar1)
  ;
  return 0;
}

Assistant:

static int emit_object(json_object *jso, int flags, json_object *parent_jso, const char *jso_key,
                       size_t *jso_index, void *userarg)
{
	printf("flags: 0x%x, key: %s, index: %ld, value: %s\n", flags,
	       (jso_key ? jso_key : "(null)"), (jso_index ? (long)*jso_index : -1L),
	       json_object_to_json_string(jso));
	return JSON_C_VISIT_RETURN_CONTINUE;
}